

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O3

double * __thiscall
mpt::value_store::set<double>(value_store *this,span<const_double> *data,long pos)

{
  double *pdVar1;
  
  if (((set<double>::traits != (type_traits *)0x0) ||
      (set<double>::traits = (type_traits *)mpt::type_traits::get(100),
      set<double>::traits != (type_traits *)0x0)) &&
     (pdVar1 = (double *)
               mpt::value_store::set
                         ((type_traits *)this,(ulong)set<double>::traits,
                          (void *)(data->_len & 0xfffffffffffffff8),(long)data->_base),
     pdVar1 != (double *)0x0)) {
    this->_type = 100;
    return pdVar1;
  }
  return (double *)0x0;
}

Assistant:

T *set(const span<const T> &data, long pos = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		void *ptr = set(*traits, data.size() * sizeof(T), data.begin(), pos);
		if (ptr) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<T *>(ptr);
	}